

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::String::FormatIntWidthN_abi_cxx11_
          (string *__return_storage_ptr__,String *this,int value,int width)

{
  long lVar1;
  stringstream ss;
  stringstream asStack_1a8 [16];
  long local_198 [2];
  long alStack_188 [12];
  ios_base local_128 [112];
  char acStack_b8 [152];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  lVar1 = *(long *)(local_198[0] + -0x18);
  if (acStack_b8[lVar1 + 1] == '\0') {
    std::ios::widen((char)asStack_1a8 + (char)lVar1 + '\x10');
    acStack_b8[lVar1 + 1] = '\x01';
  }
  acStack_b8[lVar1] = '0';
  *(long *)((long)alStack_188 + *(long *)(local_198[0] + -0x18)) = (long)value;
  std::ostream::operator<<(local_198,(int)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatIntWidthN(int value, int width) {
  std::stringstream ss;
  ss << std::setfill('0') << std::setw(width) << value;
  return ss.str();
}